

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_RoundTrip.c
# Opt level: O1

_Bool CompareStructType(StructType *struct1,StructType *struct2)

{
  _Bool _Var1;
  _Bool _Var2;
  size_t sVar3;
  SubStructType *subStruct2;
  SubStructType *subStruct1;
  bool bVar4;
  
  _Var1 = CompareSubStructType(&struct1->subStruct,&struct2->subStruct);
  sVar3 = struct1->subStructArrayCount;
  bVar4 = sVar3 == struct2->subStructArrayCount;
  if (sVar3 != 0 && bVar4) {
    subStruct1 = struct1->subStructArray;
    subStruct2 = struct2->subStructArray;
    do {
      _Var2 = CompareSubStructType(subStruct1,subStruct2);
      if (!_Var2) {
        return false;
      }
      subStruct2 = subStruct2 + 1;
      subStruct1 = subStruct1 + 1;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  return bVar4 && _Var1;
}

Assistant:

static
bool
    CompareStructType
    (
        StructType const*       struct1,
        StructType const*       struct2
    )
{
    bool same = true;

    if( !CompareSubStructType( &struct1->subStruct, &struct2->subStruct ) ) { same = false; }
    if( struct1->subStructArrayCount != struct2->subStructArrayCount ) { same = false; }
    if( struct1->subStructArrayCount == struct2->subStructArrayCount )
    {
        for( size_t i=0; i<struct1->subStructArrayCount; i++ )
        {
            if( !CompareSubStructType( &struct1->subStructArray[i], &struct2->subStructArray[i] ) ) { same = false; break; }
        }
    }

    return same;
}